

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O2

void __thiscall Pattern::readPatterNodesFromFile(Pattern *this,string *inputFile)

{
  char cVar1;
  ostream *poVar2;
  int local_33c;
  Pattern *local_338;
  vector<int,_std::allocator<int>_> *local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string line;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  string local_278;
  string local_258;
  ifstream is;
  byte abStack_218 [488];
  
  local_338 = this;
  std::ifstream::ifstream(&is,(string *)inputFile,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
    local_330 = &local_338->weight;
    while ((abStack_218[*(long *)(_is + -0x18)] & 2) == 0) {
      std::__cxx11::string::string((string *)&local_258,(string *)&line);
      std::__cxx11::string::string((string *)&local_278,"\t",(allocator *)&local_33c);
      split(&v,&local_258,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      if (0x40 < (ulong)((long)v.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)v.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::__cxx11::string::string
                  ((string *)&local_2b0,
                   (string *)
                   v.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::string
                  ((string *)&local_2f0,
                   (string *)
                   (v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        std::__cxx11::string::string((string *)&local_2d0,"&",(allocator *)&local_33c);
        split(&local_290,&local_2f0,&local_2d0);
        Graph::insertNode(&local_338->super_Graph,&local_2b0,&local_290);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_290);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2b0);
        local_33c = atoi(v.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_330,&local_33c);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&v);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&is);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)inputFile);
  poVar2 = std::operator<<(poVar2,"open failed");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(100);
}

Assistant:

void Pattern::readPatterNodesFromFile(string inputFile) {
    ifstream is(inputFile);
    string line;

    if (!is.is_open()) {
        cout << inputFile << "open failed" << endl;
        exit(100);
    }

    getline(is, line);

    while (!is.eof()) {
        vector<string> v = split(line, "\t");
        if (v.size() < 3) {
            getline(is, line);
            continue;
        }

        this->insertNode(v[0], split(v[1], "&"));
        weight.push_back(atoi(v[2].c_str()));
        getline(is, line);
    }
    is.close();
}